

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int isLikeOrGlob(Parse *pParse,Expr *pExpr,Expr **ppPrefix,int *pisComplete,int *pnoCase)

{
  byte *pbVar1;
  u32 *puVar2;
  u8 uVar3;
  short sVar4;
  undefined2 uVar5;
  sqlite3 *db;
  Expr *pEVar6;
  Expr *pExpr_00;
  ExprList *pEVar7;
  char *z;
  Vdbe *pVVar8;
  char cVar9;
  byte bVar10;
  int iVar11;
  uint uVar12;
  FuncDef *pFVar13;
  sqlite3_value *pVal;
  byte *pbVar14;
  ulong uVar15;
  size_t sVar16;
  Expr *p;
  Op *pOVar17;
  int iVar18;
  byte bVar19;
  sqlite3 *psVar20;
  ulong uVar21;
  int *piVar22;
  long lVar23;
  byte unaff_R14B;
  bool bVar24;
  double rDummy;
  byte local_74;
  Token local_40;
  
  db = pParse->db;
  bVar24 = true;
  psVar20 = db;
  if ((pExpr->x).pList != (ExprList *)0x0) {
    iVar11 = ((pExpr->x).pList)->nExpr;
    piVar22 = (int *)0x0;
    pFVar13 = sqlite3FindFunction(db,(pExpr->u).zToken,iVar11,'\x01','\0');
    if ((pFVar13 != (FuncDef *)0x0) && ((pFVar13->funcFlags & 4) != 0)) {
      pbVar14 = (byte *)pFVar13->pUserData;
      psVar20 = (sqlite3 *)(ulong)*pbVar14;
      unaff_R14B = pbVar14[1];
      local_74 = pbVar14[2];
      if (iVar11 < 3) {
        piVar22 = (int *)0x0;
LAB_00190d32:
        *pnoCase = (uint)((pFVar13->funcFlags & 8) == 0);
        bVar24 = false;
        pnoCase = piVar22;
        goto LAB_00190d3f;
      }
      pEVar7 = ((pExpr->x).pSelect)->pGroupBy;
      if ((char)pEVar7->nExpr == 'u') {
        pEVar6 = pEVar7->a[0].pExpr;
        bVar10 = pEVar6->op;
        piVar22 = (int *)(ulong)bVar10;
        if ((((bVar10 != 0) && (pEVar6->affExpr == '\0')) && (bVar10 != *pbVar14)) &&
           (bVar10 != unaff_R14B)) goto LAB_00190d32;
      }
    }
    bVar24 = true;
    pnoCase = piVar22;
  }
LAB_00190d3f:
  if (bVar24) {
    return 0;
  }
  for (pEVar6 = ((pExpr->x).pList)->a[0].pExpr;
      (pEVar6 != (Expr *)0x0 && ((pEVar6->flags & 0x2000) != 0)); pEVar6 = pEVar6->pLeft) {
  }
  pExpr_00 = *(Expr **)((pExpr->x).pList + 1);
  uVar3 = pEVar6->op;
  if ((uVar3 == 0x9c) && ((db->flags & 0x800000) == 0)) {
    sVar4 = pEVar6->iColumn;
    pVal = sqlite3VdbeGetBoundValue(pParse->pReprepare,(int)sVar4,local_74);
    if ((pVal == (sqlite3_value *)0x0) ||
       (uVar12._0_2_ = pVal->flags, uVar12._2_1_ = pVal->enc, uVar12._3_1_ = pVal->eSubtype,
       (0x4000000040004U >> ((ulong)uVar12 & 0x3f) & 1) == 0)) {
      pbVar14 = (byte *)0x0;
    }
    else {
      pbVar14 = (byte *)sqlite3ValueText(pVal,'\x01');
    }
    if (sVar4 < 0x20) {
      puVar2 = &pParse->pVdbe->expmask;
      *puVar2 = *puVar2 | 1 << ((char)sVar4 - 1U & 0x1f);
    }
    else {
      pbVar1 = (byte *)((long)&pParse->pVdbe->expmask + 3);
      *pbVar1 = *pbVar1 | 0x80;
    }
  }
  else if (uVar3 == 'u') {
    pbVar14 = (byte *)(pEVar6->u).zToken;
    pVal = (sqlite3_value *)0x0;
  }
  else {
    pVal = (sqlite3_value *)0x0;
    pbVar14 = (byte *)0x0;
  }
  if (pbVar14 != (byte *)0x0) {
    bVar10 = *pbVar14;
    bVar19 = (byte)psVar20;
    bVar24 = bVar10 == bVar19;
    iVar11 = 0;
    if (((bVar10 == 0) || (bVar10 == bVar19)) || (bVar10 == unaff_R14B)) {
      lVar23 = 0;
    }
    else {
      lVar23 = 0;
      iVar11 = 0;
      if (bVar10 != local_74) {
        iVar11 = 0;
        do {
          uVar15 = (long)iVar11 + 1;
          if ((bVar10 == (byte)pnoCase) && (pbVar14[uVar15] != 0)) {
            uVar15 = (ulong)(iVar11 + 2);
          }
          iVar11 = (int)uVar15;
          lVar23 = (long)iVar11;
          bVar10 = pbVar14[lVar23];
          bVar24 = bVar10 == bVar19;
        } while (((bVar10 != 0) && (bVar10 != bVar19)) &&
                ((bVar10 != unaff_R14B && (bVar10 != local_74))));
      }
    }
    if ((iVar11 < 2) && ((iVar18 = 0, iVar11 != 1 || (*pbVar14 == (byte)pnoCase))))
    goto LAB_0019115a;
    if (pbVar14[(long)iVar11 + -1] != 0xff) {
      uVar12 = 0;
      if (bVar24) {
        uVar12 = (uint)(pbVar14[(long)iVar11 + 1] == 0);
      }
      *pisComplete = uVar12;
      local_40.z = (char *)pbVar14;
      sVar16 = strlen((char *)pbVar14);
      local_40.n = (uint)sVar16 & 0x3fffffff;
      uVar15 = 0;
      p = sqlite3ExprAlloc(db,0x75,&local_40,0);
      if (p != (Expr *)0x0) {
        z = (p->u).zToken;
        z[lVar23] = '\0';
        if (0 < iVar11) {
          uVar15 = 0;
          iVar18 = 0;
          do {
            bVar24 = (int)z[iVar18] == ((uint)pnoCase & 0xff);
            z[uVar15] = z[(int)(iVar18 + (uint)bVar24)];
            uVar15 = uVar15 + 1;
            iVar18 = iVar18 + (uint)bVar24 + 1;
          } while (iVar18 < iVar11);
        }
        uVar21 = uVar15 & 0xffffffff;
        z[uVar21] = '\0';
        if (((pExpr_00->op != 0xa7) || (cVar9 = sqlite3ExprAffinity(pExpr_00), cVar9 != 'B')) ||
           (((pExpr_00->flags & 0x3000000) == 0 &&
            (((pExpr_00->y).pTab != (Table *)0x0 && (((pExpr_00->y).pTab)->eTabType == '\x01'))))))
        {
          iVar18 = (int)uVar15;
          iVar11 = sqlite3AtoF(z,(double *)&local_40,iVar18,'\x01');
          if ((0 < iVar11) || ((iVar18 == 1 && (*z == '-')))) {
LAB_00191023:
            sqlite3ExprDeleteNN(db,p);
            sqlite3ValueFree(pVal);
            return 0;
          }
          cVar9 = z[uVar21 - 1];
          z[uVar21 - 1] = cVar9 + '\x01';
          iVar11 = sqlite3AtoF(z,(double *)&local_40,iVar18,'\x01');
          z[uVar21 - 1] = cVar9;
          if (0 < iVar11) goto LAB_00191023;
        }
      }
      *ppPrefix = p;
      iVar18 = 1;
      if (uVar3 == 0x9c) {
        uVar5 = pEVar6->iColumn;
        uVar12 = 0x80000000;
        if ((short)uVar5 < 0x20) {
          uVar12 = 1 << ((char)uVar5 - 1U & 0x1f);
        }
        pVVar8 = pParse->pVdbe;
        pVVar8->expmask = pVVar8->expmask | uVar12;
        if ((*pisComplete != 0) && ((pEVar6->u).zToken[1] != '\0')) {
          if (pParse->nTempReg == '\0') {
            iVar11 = pParse->nMem + 1;
            pParse->nMem = iVar11;
          }
          else {
            bVar10 = pParse->nTempReg - 1;
            pParse->nTempReg = bVar10;
            iVar11 = pParse->aTempReg[bVar10];
          }
          sqlite3ExprCodeTarget(pParse,pEVar6,iVar11);
          if (pVVar8->db->mallocFailed == '\0') {
            pOVar17 = pVVar8->aOp + (long)pVVar8->nOp + -1;
          }
          else {
            pOVar17 = (Op *)&sqlite3VdbeGetOp_dummy;
          }
          pOVar17->p3 = 0;
          if (iVar11 != 0) {
            bVar10 = pParse->nTempReg;
            if ((ulong)bVar10 < 8) {
              pParse->nTempReg = bVar10 + 1;
              pParse->aTempReg[bVar10] = iVar11;
            }
          }
        }
      }
      goto LAB_0019115a;
    }
  }
  iVar18 = 0;
LAB_0019115a:
  sqlite3ValueFree(pVal);
  return iVar18;
}

Assistant:

static int isLikeOrGlob(
  Parse *pParse,    /* Parsing and code generating context */
  Expr *pExpr,      /* Test this expression */
  Expr **ppPrefix,  /* Pointer to TK_STRING expression with pattern prefix */
  int *pisComplete, /* True if the only wildcard is % in the last character */
  int *pnoCase      /* True if uppercase is equivalent to lowercase */
){
  const u8 *z = 0;           /* String on RHS of LIKE operator */
  Expr *pRight, *pLeft;      /* Right and left size of LIKE operator */
  ExprList *pList;           /* List of operands to the LIKE operator */
  u8 c;                      /* One character in z[] */
  int cnt;                   /* Number of non-wildcard prefix characters */
  u8 wc[4];                  /* Wildcard characters */
  sqlite3 *db = pParse->db;  /* Database connection */
  sqlite3_value *pVal = 0;
  int op;                    /* Opcode of pRight */
  int rc;                    /* Result code to return */

  if( !sqlite3IsLikeFunction(db, pExpr, pnoCase, (char*)wc) ){
    return 0;
  }
#ifdef SQLITE_EBCDIC
  if( *pnoCase ) return 0;
#endif
  assert( ExprUseXList(pExpr) );
  pList = pExpr->x.pList;
  pLeft = pList->a[1].pExpr;

  pRight = sqlite3ExprSkipCollate(pList->a[0].pExpr);
  op = pRight->op;
  if( op==TK_VARIABLE && (db->flags & SQLITE_EnableQPSG)==0 ){
    Vdbe *pReprepare = pParse->pReprepare;
    int iCol = pRight->iColumn;
    pVal = sqlite3VdbeGetBoundValue(pReprepare, iCol, SQLITE_AFF_BLOB);
    if( pVal && sqlite3_value_type(pVal)==SQLITE_TEXT ){
      z = sqlite3_value_text(pVal);
    }
    sqlite3VdbeSetVarmask(pParse->pVdbe, iCol);
    assert( pRight->op==TK_VARIABLE || pRight->op==TK_REGISTER );
  }else if( op==TK_STRING ){
    assert( !ExprHasProperty(pRight, EP_IntValue) );
     z = (u8*)pRight->u.zToken;
  }
  if( z ){

    /* Count the number of prefix characters prior to the first wildcard */
    cnt = 0;
    while( (c=z[cnt])!=0 && c!=wc[0] && c!=wc[1] && c!=wc[2] ){
      cnt++;
      if( c==wc[3] && z[cnt]!=0 ) cnt++;
    }

    /* The optimization is possible only if (1) the pattern does not begin
    ** with a wildcard and if (2) the non-wildcard prefix does not end with
    ** an (illegal 0xff) character, or (3) the pattern does not consist of
    ** a single escape character. The second condition is necessary so
    ** that we can increment the prefix key to find an upper bound for the
    ** range search. The third is because the caller assumes that the pattern
    ** consists of at least one character after all escapes have been
    ** removed.  */
    if( (cnt>1 || (cnt>0 && z[0]!=wc[3])) && 255!=(u8)z[cnt-1] ){
      Expr *pPrefix;

      /* A "complete" match if the pattern ends with "*" or "%" */
      *pisComplete = c==wc[0] && z[cnt+1]==0;

      /* Get the pattern prefix.  Remove all escapes from the prefix. */
      pPrefix = sqlite3Expr(db, TK_STRING, (char*)z);
      if( pPrefix ){
        int iFrom, iTo;
        char *zNew;
        assert( !ExprHasProperty(pPrefix, EP_IntValue) );
        zNew = pPrefix->u.zToken;
        zNew[cnt] = 0;
        for(iFrom=iTo=0; iFrom<cnt; iFrom++){
          if( zNew[iFrom]==wc[3] ) iFrom++;
          zNew[iTo++] = zNew[iFrom];
        }
        zNew[iTo] = 0;
        assert( iTo>0 );

        /* If the LHS is not an ordinary column with TEXT affinity, then the
        ** pattern prefix boundaries (both the start and end boundaries) must
        ** not look like a number.  Otherwise the pattern might be treated as
        ** a number, which will invalidate the LIKE optimization.
        **
        ** Getting this right has been a persistent source of bugs in the
        ** LIKE optimization.  See, for example:
        **    2018-09-10 https://sqlite.org/src/info/c94369cae9b561b1
        **    2019-05-02 https://sqlite.org/src/info/b043a54c3de54b28
        **    2019-06-10 https://sqlite.org/src/info/fd76310a5e843e07
        **    2019-06-14 https://sqlite.org/src/info/ce8717f0885af975
        **    2019-09-03 https://sqlite.org/src/info/0f0428096f17252a
        */
        if( pLeft->op!=TK_COLUMN
         || sqlite3ExprAffinity(pLeft)!=SQLITE_AFF_TEXT
         || (ALWAYS( ExprUseYTab(pLeft) )
             && ALWAYS(pLeft->y.pTab)
             && IsVirtual(pLeft->y.pTab))  /* Might be numeric */
        ){
          int isNum;
          double rDummy;
          isNum = sqlite3AtoF(zNew, &rDummy, iTo, SQLITE_UTF8);
          if( isNum<=0 ){
            if( iTo==1 && zNew[0]=='-' ){
              isNum = +1;
            }else{
              zNew[iTo-1]++;
              isNum = sqlite3AtoF(zNew, &rDummy, iTo, SQLITE_UTF8);
              zNew[iTo-1]--;
            }
          }
          if( isNum>0 ){
            sqlite3ExprDelete(db, pPrefix);
            sqlite3ValueFree(pVal);
            return 0;
          }
        }
      }
      *ppPrefix = pPrefix;

      /* If the RHS pattern is a bound parameter, make arrangements to
      ** reprepare the statement when that parameter is rebound */
      if( op==TK_VARIABLE ){
        Vdbe *v = pParse->pVdbe;
        sqlite3VdbeSetVarmask(v, pRight->iColumn);
        assert( !ExprHasProperty(pRight, EP_IntValue) );
        if( *pisComplete && pRight->u.zToken[1] ){
          /* If the rhs of the LIKE expression is a variable, and the current
          ** value of the variable means there is no need to invoke the LIKE
          ** function, then no OP_Variable will be added to the program.
          ** This causes problems for the sqlite3_bind_parameter_name()
          ** API. To work around them, add a dummy OP_Variable here.
          */
          int r1 = sqlite3GetTempReg(pParse);
          sqlite3ExprCodeTarget(pParse, pRight, r1);
          sqlite3VdbeChangeP3(v, sqlite3VdbeCurrentAddr(v)-1, 0);
          sqlite3ReleaseTempReg(pParse, r1);
        }
      }
    }else{
      z = 0;
    }
  }

  rc = (z!=0);
  sqlite3ValueFree(pVal);
  return rc;
}